

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O1

void __thiscall covenant::DFA<covenant::Sym>::eps_close(DFA<covenant::Sym> *this,int state)

{
  vector<int,std::allocator<int>> *this_00;
  uint uVar1;
  uint value;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int *__args;
  SparseSet<0> reach;
  SparseSet<0> local_58;
  
  local_58.dom = (int)((long)(this->trans).
                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->trans).
                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_58._vptr_SparseSet = (_func_int **)&PTR_insert_001aaf90;
  uVar6 = (ulong)local_58.dom;
  local_58.sparse = (uint *)operator_new__(uVar6 << 2);
  local_58.dense = (uint *)operator_new__(uVar6 << 2);
  local_58.members = 0;
  SparseSet<0>::insert(&local_58,state);
  pvVar2 = (this->eps).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = pvVar2[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar4) {
    uVar6 = 0;
    uVar5 = 1;
    do {
      uVar1 = piVar4[uVar6];
      if ((local_58.members <= local_58.sparse[uVar1]) ||
         (local_58.dense[local_58.sparse[uVar1]] != uVar1)) {
        SparseSet<0>::insert(&local_58,uVar1);
      }
      pvVar2 = (this->eps).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = pvVar2[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar5 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar2[state].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar4 >> 2);
      uVar6 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar3);
  }
  if (1 < local_58.members) {
    uVar6 = 1;
    do {
      uVar1 = local_58.dense[uVar6];
      pvVar2 = (this->eps).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = pvVar2[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar4) {
        uVar7 = 1;
        uVar5 = 0;
        do {
          value = piVar4[uVar5];
          if ((local_58.members <= local_58.sparse[value]) ||
             (local_58.dense[local_58.sparse[value]] != value)) {
            SparseSet<0>::insert(&local_58,value);
            pvVar2 = (this->eps).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __args = (int *)(uVar5 * 4 +
                            *(long *)&pvVar2[(int)uVar1].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data);
            this_00 = (vector<int,std::allocator<int>> *)(pvVar2 + state);
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          uVar5 = (ulong)uVar7;
          pvVar2 = (this->eps).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = pvVar2[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = uVar7 + 1;
        } while (uVar5 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar2[(int)uVar1].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 8) - (long)piVar4
                                >> 2));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_58.members);
  }
  SparseSet<0>::~SparseSet(&local_58);
  return;
}

Assistant:

void eps_close(int state)
    {
      SparseSet<> reach(nStates());
      reach.insert(state);
      for(unsigned int ei = 0; ei < eps[state].size(); ei++)
      {
        // Added the conditional test after observing some problems
        // running the CFG solver.
        if(!reach.elem(eps[state][ei]))
          reach.insert(eps[state][ei]);
      }

      for(unsigned int ii = 1; ii < reach.size(); ii++)
      {
        int es = reach[ii];
        for(unsigned int ei = 0; ei < eps[es].size(); ei++)
        {
          // Not yet processed
          if(!reach.elem(eps[es][ei]))
          { 
            reach.insert(eps[es][ei]);
            eps[state].push_back(eps[es][ei]);
          }
        }
      }
    }